

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O3

nng_err nni_http_res_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  byte bVar1;
  size_t sVar2;
  nng_err nVar3;
  nng_http_status status;
  nni_http_res *pnVar4;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  
  pnVar4 = nni_http_conn_res(conn);
  if (n == 0) {
    nVar3 = NNG_EAGAIN;
    sVar9 = 0;
  }
  else {
    sVar2 = 0;
    do {
      sVar9 = sVar2;
      uVar8 = 0;
      bVar7 = 0;
      while (bVar1 = *(byte *)((long)buf + uVar8), bVar1 != 10) {
        nVar3 = NNG_EPROTO;
        if ((bVar7 == 0xd) || (bVar1 < 0x20 && bVar1 != 0xd)) goto LAB_0013b268;
        uVar8 = uVar8 + 1;
        bVar7 = bVar1;
        if (n == uVar8) {
          nVar3 = NNG_EAGAIN;
          goto LAB_0013b268;
        }
      }
      *(char *)((long)buf + (uVar8 - (bVar7 == 0xd))) = '\0';
      if (*buf == '\0') {
        (pnVar4->data).parsed = false;
        sVar9 = sVar9 + uVar8 + 1;
        nVar3 = NNG_OK;
        goto LAB_0013b268;
      }
      if ((pnVar4->data).parsed == false) {
        pcVar5 = strchr((char *)buf,0x20);
        nVar3 = NNG_EPROTO;
        if (pcVar5 == (char *)0x0) goto LAB_0013b29a;
        *pcVar5 = '\0';
        pcVar6 = strchr(pcVar5 + 1,0x20);
        if (pcVar6 == (char *)0x0) goto LAB_0013b29a;
        *pcVar6 = '\0';
        status = atoi(pcVar5 + 1);
        if (status - 1000 < 0xfffffc7c) goto LAB_0013b29a;
        nni_http_set_status(conn,status,pcVar6 + 1);
        nVar3 = nni_http_set_version(conn,(char *)buf);
        if (nVar3 != NNG_OK) goto LAB_0013b29a;
        (pnVar4->data).parsed = true;
      }
      else {
        nVar3 = http_parse_header(conn,buf);
        if (nVar3 != NNG_OK) goto LAB_0013b29a;
      }
      buf = (void *)((long)buf + uVar8 + 1);
      uVar10 = n - 1;
      sVar2 = sVar9 + uVar8 + 1;
      n = ~uVar8 + n;
    } while (uVar10 != uVar8);
    nVar3 = NNG_EAGAIN;
LAB_0013b29a:
    sVar9 = sVar9 + uVar8 + 1;
  }
LAB_0013b268:
  *lenp = sVar9;
  return nVar3;
}

Assistant:

nng_err
nni_http_res_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nng_http_res *res = nni_http_conn_res(conn);
	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (res->data.parsed) {
			rv = http_parse_header(conn, line);
		} else if ((rv = http_res_parse_line(conn, line)) == 0) {
			res->data.parsed = true;
		}

		if (rv != 0) {
			break;
		}
	}

	if (rv == 0) {
		res->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}